

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::allTerminal
          (CycleBreaking<covenant::Sym> *this,const_iterator Begin,const_iterator End,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  bool bVar1;
  Sym *s;
  
  do {
    s = Begin._M_current;
    if (s == End._M_current) break;
    bVar1 = isTerminal(this,s,scc);
    Begin._M_current = s + 1;
  } while (bVar1);
  return s == End._M_current;
}

Assistant:

bool allTerminal (typename vector<EdgeSym>::const_iterator Begin, 
                    typename vector<EdgeSym>::const_iterator End, 
                    const set<int> &scc)
  {
    for (typename vector<EdgeSym>::const_iterator I = Begin; I != End; ++I)
    {
      if (!isTerminal(*I,scc)) return false;
    }
    return true;
  }